

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkits_testcases-inl.h
# Opt level: O3

void __thiscall
bssl::gtest_suite_PkitsTest10PolicyMappings_::
Section10ValidPolicyMappingTest9<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>::
~Section10ValidPolicyMappingTest9
          (Section10ValidPolicyMappingTest9<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

WRAPPED_TYPED_TEST_P(PkitsTest10PolicyMappings,
                     Section10ValidPolicyMappingTest9) {
  const char* const certs[] = {"TrustAnchorRootCertificate",
                               "PanyPolicyMapping1to2CACert",
                               "ValidPolicyMappingTest9EE"};
  const char* const crls[] = {"TrustAnchorRootCRL",
                              "PanyPolicyMapping1to2CACRL"};
  PkitsTestInfo info;
  info.test_number = "4.10.9";
  info.should_validate = true;

  this->RunTest(certs, crls, info);
}